

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O1

void __thiscall QTextEditPrivate::cursorPositionChanged(QTextEditPrivate *this)

{
  QObject *pQVar1;
  undefined4 uVar2;
  long in_FS_OFFSET;
  QWidgetTextControl local_50 [8];
  code *local_48;
  undefined1 *puStack_40;
  QObject *local_38;
  undefined8 uStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QObject **)
            &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
             field_0x8;
  QMetaObject::activate(pQVar1,&QTextEdit::staticMetaObject,6,(void **)0x0);
  local_38 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  uStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = (code *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QWidgetTextControl::textCursor(local_50);
  uVar2 = QTextCursor::position();
  local_48 = QTextCursor::isNull;
  uStack_30 = (undefined1 *)CONCAT44(uVar2,0xffffffff);
  puStack_40 = (undefined1 *)CONCAT44(puStack_40._4_4_,0x11b);
  local_38 = pQVar1;
  QTextCursor::~QTextCursor((QTextCursor *)local_50);
  QAccessible::updateAccessibility((QAccessibleEvent *)&local_48);
  QAccessibleTextCursorEvent::~QAccessibleTextCursorEvent((QAccessibleTextCursorEvent *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextEditPrivate::cursorPositionChanged()
{
    Q_Q(QTextEdit);
    emit q->cursorPositionChanged();
#if QT_CONFIG(accessibility)
    QAccessibleTextCursorEvent event(q, q->textCursor().position());
    QAccessible::updateAccessibility(&event);
#endif
}